

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O2

plugin loader_host_initialize(void)

{
  int iVar1;
  loader_impl impl;
  undefined8 uVar2;
  type t;
  char *name;
  plugin ppVar3;
  
  impl = loader_impl_create_host("__metacall_host__");
  ppVar3 = (plugin)0x0;
  if (impl != (loader_impl)0x0) {
    for (; (int)ppVar3 != 0x13; ppVar3 = (plugin)(ulong)((int)ppVar3 + 1)) {
      uVar2 = type_id_name(ppVar3);
      t = (type)type_create(ppVar3,uVar2,0,0);
      if (t != (type)0x0) {
        name = (char *)type_name(t);
        iVar1 = loader_impl_type_define(impl,name,t);
        if (iVar1 != 0) {
          type_destroy(t);
          goto LAB_00107620;
        }
      }
    }
    ppVar3 = (plugin)plugin_create("__metacall_host__",0,0,impl,loader_host_destroy_dtor);
    if (ppVar3 == (plugin)0x0) {
LAB_00107620:
      loader_host_destroy(impl);
      ppVar3 = (plugin)0x0;
    }
  }
  return ppVar3;
}

Assistant:

plugin loader_host_initialize(void)
{
	static const loader_tag tag = LOADER_HOST_NAME;
	loader_impl host = loader_impl_create_host(tag);
	type_id id;

	if (host == NULL)
	{
		return NULL;
	}

	for (id = 0; id < TYPE_SIZE; ++id)
	{
		type t = type_create(id, type_id_name(id), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(host, type_name(t), t) != 0)
			{
				type_destroy(t);
				goto error;
			}
		}
	}

	plugin p = plugin_create(LOADER_HOST_NAME, NULL, NULL, host, &loader_host_destroy_dtor);

	if (p == NULL)
	{
		goto error;
	}

	return p;
error:
	loader_host_destroy(host);
	return NULL;
}